

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__free_jpeg_components(stbi__jpeg *z,int ncomp,int why)

{
  undefined8 *puVar1;
  void *pvVar2;
  ulong uVar3;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  long lVar4;
  long lVar5;
  
  uVar3 = (ulong)(uint)(~(ncomp >> 0x1f) & ncomp);
  lVar4 = uVar3 * 0x60;
  for (lVar5 = 0; lVar4 - lVar5 != 0; lVar5 = lVar5 + 0x60) {
    pvVar2 = *(void **)((long)&z->img_comp[0].raw_data + lVar5);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      puVar1 = (undefined8 *)((long)&z->img_comp[0].data + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      uVar3 = extraout_RAX;
    }
    pvVar2 = *(void **)((long)&z->img_comp[0].raw_coeff + lVar5);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      *(undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar5) = 0;
      *(undefined8 *)((long)&z->img_comp[0].coeff + lVar5) = 0;
      uVar3 = extraout_RAX_00;
    }
    pvVar2 = *(void **)((long)&z->img_comp[0].linebuf + lVar5);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar5) = 0;
      uVar3 = extraout_RAX_01;
    }
  }
  return (int)uVar3;
}

Assistant:

static int stbi__free_jpeg_components(stbi__jpeg *z, int ncomp, int why)
{
   int i;
   for (i=0; i < ncomp; ++i) {
      if (z->img_comp[i].raw_data) {
         STBI_FREE(z->img_comp[i].raw_data);
         z->img_comp[i].raw_data = NULL;
         z->img_comp[i].data = NULL;
      }
      if (z->img_comp[i].raw_coeff) {
         STBI_FREE(z->img_comp[i].raw_coeff);
         z->img_comp[i].raw_coeff = 0;
         z->img_comp[i].coeff = 0;
      }
      if (z->img_comp[i].linebuf) {
         STBI_FREE(z->img_comp[i].linebuf);
         z->img_comp[i].linebuf = NULL;
      }
   }
   return why;
}